

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.h
# Opt level: O2

Future<CreateResponse> * __thiscall Future<CreateResponse>::get(Future<CreateResponse> *this)

{
  long in_RSI;
  CreateResponse aCStack_b8 [160];
  
  if ((*(char *)(in_RSI + 0xb8) == '\0') && (*(undefined8 **)(in_RSI + 8) != (undefined8 *)0x0)) {
    (**(code **)**(undefined8 **)(in_RSI + 8))(aCStack_b8);
    CreateResponse::operator=((CreateResponse *)(in_RSI + 0x18),aCStack_b8);
    CreateResponse::~CreateResponse(aCStack_b8);
    *(undefined1 *)(in_RSI + 0xb8) = 1;
  }
  CreateResponse::CreateResponse((CreateResponse *)this,(CreateResponse *)(in_RSI + 0x18));
  return this;
}

Assistant:

virtual T get() {
    if (!is_done_ && task_ != nullptr) {
      result_ = task_->get();
      is_done_ = true;
    }
    return result_;
  }